

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O2

double __thiscall IF97::Backwards::BackwardsRegion::t_hs(BackwardsRegion *this,double h,double s)

{
  double dVar1;
  double dVar2;
  double dVar3;
  size_t i;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar1 = this->h_star;
  dVar2 = this->s_star;
  dVar5 = 0.0;
  for (uVar4 = 0; uVar4 < this->N; uVar4 = uVar4 + 1) {
    dVar3 = (this->n).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4];
    dVar6 = pow(this->a + h / dVar1,
                (this->I).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4]);
    dVar7 = pow(this->b + s / dVar2,
                (this->J).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4]);
    dVar5 = dVar5 + dVar7 * dVar6 * dVar3;
  }
  return dVar5 * this->T_star;
}

Assistant:

virtual double t_hs(double h, double s) const{
                const double eta = h/h_star, sigma = s/s_star;
                double summer = 0;
                for (std::size_t i = 0; i < N; ++i){
                    summer += n[i]*std::pow(eta+a, I[i])*std::pow(sigma+b, J[i]);
                }
                return summer*T_star;
            }